

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_lightning.cpp
# Opt level: O1

void __thiscall DLightningThinker::Serialize(DLightningThinker *this,FArchive *arc)

{
  FArchive *pFVar1;
  short *psVar2;
  int iVar3;
  ulong uVar4;
  WORD *w;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->Stopped);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->NextLightningFlash);
  FArchive::operator<<(pFVar1,(DWORD *)&this->LightningFlashCount);
  if (arc->m_Loading == true) {
    if (this->LightningLightLevels != (short *)0x0) {
      operator_delete__(this->LightningLightLevels);
    }
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)numsectors) {
      uVar4 = (long)numsectors * 2;
    }
    psVar2 = (short *)operator_new__(uVar4);
    this->LightningLightLevels = psVar2;
  }
  if (0 < numsectors) {
    w = (WORD *)this->LightningLightLevels;
    iVar3 = numsectors + 1;
    do {
      FArchive::operator<<(arc,w);
      w = w + 1;
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

void DLightningThinker::Serialize (FArchive &arc)
{
	int i;
	short *lights;

	Super::Serialize (arc);

	arc << Stopped << NextLightningFlash << LightningFlashCount;

	if (arc.IsLoading ())
	{
		if (LightningLightLevels != NULL)
		{
			delete[] LightningLightLevels;
		}
		LightningLightLevels = new short[numsectors];
	}
	lights = LightningLightLevels;
	for (i = numsectors; i > 0; ++lights, --i)
	{
		arc << *lights;
	}
}